

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyHashingShardedKVS.hpp
# Opt level: O0

optional<supermap::ByteArray<3UL>_> __thiscall
supermap::KeyHashingShardedKVS<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>::
getValue(KeyHashingShardedKVS<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long> *this,
        Key<2UL> *key)

{
  size_t __n;
  pointer pKVar1;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  long in_RSI;
  _Storage<supermap::ByteArray<3UL>,_false> in_RDI;
  optional<supermap::ByteArray<3UL>_> oVar2;
  _Storage<supermap::ByteArray<3UL>,_false> _Var3;
  
  _Var3 = in_RDI;
  __n = getShardIdForKey((KeyHashingShardedKVS<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>
                          *)in_RDI,(Key<2UL> *)in_RDI);
  std::
  vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>_>_>
  ::operator[]((vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>_>_>
                *)(in_RSI + 8),__n);
  pKVar1 = std::
           unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>
           ::operator->((unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>
                         *)0x1befb0);
  (*pKVar1->_vptr_KeyValueStorage[1])(in_RDI,pKVar1,in_RDX);
  oVar2.super__Optional_base<supermap::ByteArray<3UL>,_false,_false>._M_payload.
  super__Optional_payload<supermap::ByteArray<3UL>,_true,_false,_false>.
  super__Optional_payload_base<supermap::ByteArray<3UL>_>._8_8_ = extraout_RDX;
  oVar2.super__Optional_base<supermap::ByteArray<3UL>,_false,_false>._M_payload.
  super__Optional_payload<supermap::ByteArray<3UL>,_true,_false,_false>.
  super__Optional_payload_base<supermap::ByteArray<3UL>_>._M_payload = _Var3;
  return (optional<supermap::ByteArray<3UL>_>)
         oVar2.super__Optional_base<supermap::ByteArray<3UL>,_false,_false>._M_payload.
         super__Optional_payload<supermap::ByteArray<3UL>,_true,_false,_false>.
         super__Optional_payload_base<supermap::ByteArray<3UL>_>;
}

Assistant:

std::optional<Value> getValue(const Key &key) override {
        return nestedStorages_[getShardIdForKey(key)]->getValue(key);
    }